

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

void addnum2buff(BuffFS *buff,TValue *num)

{
  int iVar1;
  
  if (0x9b < (long)buff->blen) {
    pushstr(buff,buff->space,(long)buff->blen);
    buff->blen = 0;
  }
  iVar1 = tostringbuff(num,buff->space + buff->blen);
  buff->blen = buff->blen + iVar1;
  return;
}

Assistant:

static void addnum2buff (BuffFS *buff, TValue *num) {
  char *numbuff = getbuff(buff, MAXNUMBER2STR);
  int len = tostringbuff(num, numbuff);  /* format number into 'numbuff' */
  addsize(buff, len);
}